

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fphdlimp.cpp
# Opt level: O3

void __thiscall
icu_63::FieldPositionIteratorHandler::FieldPositionIteratorHandler
          (FieldPositionIteratorHandler *this,FieldPositionIterator *posIter,UErrorCode *_status)

{
  UErrorCode UVar1;
  UVector32 *this_00;
  
  (this->super_FieldPositionHandler).fShift = 0;
  (this->super_FieldPositionHandler)._vptr_FieldPositionHandler =
       (_func_int **)&PTR__FieldPositionIteratorHandler_003b1178;
  this->iter = posIter;
  this->vec = (UVector32 *)0x0;
  UVar1 = *_status;
  this->status = UVar1;
  if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR && posIter != (FieldPositionIterator *)0x0) {
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)posIter);
    if (this_00 != (UVector32 *)0x0) {
      UVector32::UVector32(this_00,&this->status);
    }
    this->vec = this_00;
  }
  return;
}

Assistant:

void FieldPositionHandler::setShift(int32_t delta) {
  fShift = delta;
}